

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk.c
# Opt level: O1

void hd_drop_dest_disk(hd_context *ctx,hd_disk_dest *disk)

{
  int iVar1;
  
  if (((disk != (hd_disk_dest *)0x0) && (0 < disk->refs)) &&
     (iVar1 = disk->refs + -1, disk->refs = iVar1, iVar1 == 0)) {
    if (-1 < disk->dev_fd) {
      close(disk->dev_fd);
      disk->dev_fd = 0;
    }
    hd_free(ctx,disk);
    return;
  }
  return;
}

Assistant:

void
hd_drop_dest_disk(hd_context *ctx, hd_disk_dest *disk)
{
    if (hd_drop_imp(ctx, disk, &disk->refs))
    {
        SAFE_DEV_CLOSE(disk->dev_fd);
        hd_free(ctx, disk);
    }
}